

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_bench.cc
# Opt level: O3

int main(void)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  uint uVar6;
  value_type_conflict *__val;
  ulong uVar7;
  result_type rVar8;
  size_t __i;
  long lVar9;
  pointer puVar10;
  uint64_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertex_ids;
  uniform_int_distribution<unsigned_long> elem_id_dist;
  uniform_int_distribution<unsigned_long> vertex_id_dist;
  mt19937 gen;
  random_device rd;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2828;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_2808;
  uniform_int_distribution<unsigned_long> local_27f0;
  uniform_int_distribution<unsigned_long> local_27e0;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_27d0;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_27b8;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_27a0;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_2788;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_2770;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_2758;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar6 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar6;
  lVar9 = 1;
  uVar7 = local_2740._M_x[0];
  do {
    uVar7 = (ulong)(((uint)(uVar7 >> 0x1e) ^ (uint)uVar7) * 0x6c078965 + (int)lVar9);
    local_2740._M_x[lVar9] = uVar7;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x270);
  local_2740._M_p = 0x270;
  local_27e0._M_param._M_a = 0;
  local_27e0._M_param._M_b = 0x800000000;
  local_27f0._M_param._M_a = 0;
  local_27f0._M_param._M_b = 4999999;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"generating dataset .",0x14);
  std::ostream::flush();
  local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(40000000);
  puVar10 = local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start + 5000000;
  lVar9 = 0;
  local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar10;
  memset(local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start,0,40000000);
  local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar10;
  do {
    rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_27e0,&local_2740,&local_27e0._M_param);
    local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[lVar9] = rVar8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 5000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
  std::ostream::flush();
  local_2808.
  super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2808.
  super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2808.
  super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2808.
  super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(800000000);
  local_2808.
  super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_2808.
       super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 25000000;
  (local_2808.
   super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->_M_elems[2] = 0;
  (local_2808.
   super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->_M_elems[3] = 0;
  (local_2808.
   super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0] = 0;
  (local_2808.
   super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1] = 0;
  lVar9 = 0x20;
  do {
    uVar2 = (local_2808.
             super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0];
    uVar3 = (local_2808.
             super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1];
    uVar4 = (local_2808.
             super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems[3];
    puVar1 = (unsigned_long *)
             ((long)(local_2808.
                     super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9 + 0x10);
    *puVar1 = (local_2808.
               super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_elems[2];
    puVar1[1] = uVar4;
    puVar1 = (unsigned_long *)
             ((long)(local_2808.
                     super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9);
    *puVar1 = uVar2;
    puVar1[1] = uVar3;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 800000000);
  lVar9 = 0x18;
  local_2808.
  super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_2808.
       super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  do {
    rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_27f0,&local_2740,&local_27f0._M_param);
    uVar2 = local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[rVar8];
    rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_27f0,&local_2740,&local_27f0._M_param);
    uVar3 = local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[rVar8];
    rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_27f0,&local_2740,&local_27f0._M_param);
    uVar4 = local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[rVar8];
    rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_27f0,&local_2740,&local_27f0._M_param);
    uVar5 = local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[rVar8];
    *(unsigned_long *)
     ((long)(local_2808.
             super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9 + -0x18) = uVar2;
    *(unsigned_long *)
     ((long)(local_2808.
             super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9 + -0x10) = uVar3;
    *(unsigned_long *)
     ((long)(local_2808.
             super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9 + -8) = uVar4;
    *(unsigned_long *)
     ((long)(local_2808.
             super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9) = uVar5;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x2faf0818);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," done",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"std::unordered_map, 1 thread: ",0x1e);
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&local_2758,&local_2808);
  renumber<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
            (&local_2828,&local_2758,1);
  if (local_2758.
      super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2758.
                    super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"std::unordered_map, 32 thread (single threaded insertion): ",
             0x3b);
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&local_2770,&local_2808);
  renumber<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
            (&local_2828,&local_2770,0x20);
  if (local_2770.
      super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2770.
                    super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pmap4, 1 thread: ",0x11)
  ;
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&local_2788,&local_2808);
  renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,phmap::NullMutex>>
            (&local_2828,&local_2788,1);
  if (local_2788.
      super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2788.
                    super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"pmap4, 32 threads: ",0x13);
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&local_27a0,&local_2808);
  renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,phmap::NullMutex>>
            (&local_2828,&local_27a0,0x20);
  if (local_27a0.
      super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_27a0.
                    super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pmap6, 1 thread: ",0x11)
  ;
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&local_27b8,&local_2808);
  renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,6ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,6ul,phmap::NullMutex>>
            (&local_2828,&local_27b8,1);
  if (local_27b8.
      super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_27b8.
                    super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"pmap6, 32 threads: ",0x13);
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&local_27d0,&local_2808);
  renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,6ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,6ul,phmap::NullMutex>>
            (&local_2828,&local_27d0,0x20);
  if (local_27d0.
      super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_27d0.
                    super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2808.
      super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2808.
                    super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2828.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  return 0;
}

Assistant:

int main() {
    uint64_t nvertices = 5000000;
    uint64_t nelements = 25000000;

    std::random_device rd;  // a seed source for the random number engine
    std::mt19937 gen(rd()); // mersenne_twister_engine seeded with rd()
    std::uniform_int_distribution<uint64_t> vertex_id_dist(0, uint64_t(1) << 35);
    std::uniform_int_distribution<uint64_t> elem_id_dist(0, nvertices-1);

    std::cout << "generating dataset ." << std::flush;
    std::vector< uint64_t > vertex_ids(nvertices);
    for (uint64_t i = 0; i < nvertices; i++) {
        vertex_ids[i] = vertex_id_dist(gen);
    }

    std::cout << "." << std::flush;

    std::vector< std::array<uint64_t, 4> > elements(nelements);
    for (uint64_t i = 0; i < nelements; i++) {
        elements[i] = {
            vertex_ids[elem_id_dist(gen)], 
            vertex_ids[elem_id_dist(gen)], 
            vertex_ids[elem_id_dist(gen)], 
            vertex_ids[elem_id_dist(gen)]
        };
    }
    std::cout << " done" << std::endl;

    using stdmap = std::unordered_map<uint64_t, uint64_t>;
    std::cout << "std::unordered_map, 1 thread: ";
    renumber< stdmap, stdmap >(vertex_ids, elements, 1);

    std::cout << "std::unordered_map, 32 thread (single threaded insertion): ";
    renumber< stdmap, stdmap >(vertex_ids, elements, 32);

    std::cout << "pmap4, 1 thread: ";
    renumber< pmap<4>, pmap_nullmutex<4> >(vertex_ids, elements, 1);

    std::cout << "pmap4, 32 threads: ";
    renumber< pmap<4>, pmap_nullmutex<4> >(vertex_ids, elements, 32);

    std::cout << "pmap6, 1 thread: ";
    renumber< pmap<6>, pmap_nullmutex<6> >(vertex_ids, elements, 1);

    std::cout << "pmap6, 32 threads: ";
    renumber< pmap<6>, pmap_nullmutex<6> >(vertex_ids, elements, 32);
}